

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  ImGuiID *pIVar1;
  ImGuiID *pIVar2;
  ImVec2 IVar3;
  ImGuiID IVar4;
  ImGuiWindow *pIVar5;
  ImGuiContext *pIVar6;
  ImGuiContext *g;
  float fVar7;
  float fVar8;
  ImVec2 pos;
  ImVec2 local_10;
  
  pIVar6 = GImGui;
  pIVar5 = GImGui->MovingWindow;
  if (pIVar5 == (ImGuiWindow *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow *)0x0) {
      return;
    }
    IVar4 = GImGui->ActiveId;
    if (GImGui->ActiveIdWindow->MoveId != IVar4) {
      return;
    }
    GImGui->ActiveIdIsAlive = IVar4;
    if (pIVar6->ActiveIdPreviousFrame == IVar4) {
      pIVar6->ActiveIdPreviousFrameIsAlive = true;
    }
    if ((pIVar6->IO).MouseDown[0] != false) {
      return;
    }
    SetActiveID(0,(ImGuiWindow *)0x0);
    return;
  }
  pIVar1 = &GImGui->ActiveId;
  pIVar2 = &GImGui->ActiveIdPreviousFrame;
  GImGui->ActiveIdIsAlive = *pIVar1;
  if (*pIVar2 == *pIVar1) {
    pIVar6->ActiveIdPreviousFrameIsAlive = true;
  }
  if ((pIVar6->IO).MouseDown[0] != true) {
LAB_00119ea3:
    SetActiveID(0,(ImGuiWindow *)0x0);
    pIVar6->MovingWindow = (ImGuiWindow *)0x0;
    return;
  }
  IVar3 = (pIVar6->IO).MousePos;
  fVar7 = IVar3.x;
  if ((fVar7 < -256000.0) || (fVar8 = IVar3.y, fVar8 < -256000.0)) goto LAB_00119ea3;
  pIVar5 = pIVar5->RootWindow;
  local_10.x = fVar7 - (pIVar6->ActiveIdClickOffset).x;
  local_10.y = fVar8 - (pIVar6->ActiveIdClickOffset).y;
  fVar7 = (pIVar5->Pos).x;
  if ((fVar7 == local_10.x) && (!NAN(fVar7) && !NAN(local_10.x))) {
    fVar7 = (pIVar5->Pos).y;
    if ((fVar7 == local_10.y) && (!NAN(fVar7) && !NAN(local_10.y))) goto LAB_00119e95;
  }
  if (((pIVar5->Flags & 0x100) == 0) && (pIVar6->SettingsDirtyTimer <= 0.0)) {
    pIVar6->SettingsDirtyTimer = (pIVar6->IO).IniSavingRate;
  }
  SetWindowPos(pIVar5,&local_10,1);
LAB_00119e95:
  FocusWindow(pIVar6->MovingWindow);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            ClearActiveID();
            g.MovingWindow = NULL;
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}